

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

void __thiscall QFileSystemModel::fetchMore(QFileSystemModel *this,QModelIndex *parent)

{
  long lVar1;
  QFileInfoGatherer *this_00;
  quintptr qVar2;
  quintptr qVar3;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if (*(char *)(lVar1 + 0x1b2) == '\x01') {
    qVar3 = lVar1 + 0x138U;
    if ((parent->m).ptr != (QAbstractItemModel *)0x0) {
      qVar3 = parent->i;
    }
    qVar2 = lVar1 + 0x138U;
    if (-1 < (parent->c | parent->r)) {
      qVar2 = qVar3;
    }
    if (*(char *)(qVar2 + 0x4c) == '\0') {
      *(undefined1 *)(qVar2 + 0x4c) = 1;
      this_00 = *(QFileInfoGatherer **)(lVar1 + 0xe0);
      filePath(&local_30,this,parent);
      QFileInfoGatherer::list(this_00,&local_30);
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::fetchMore(const QModelIndex &parent)
{
    Q_D(QFileSystemModel);
    if (!d->setRootPath)
        return;
    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    if (indexNode->populatedChildren)
        return;
    indexNode->populatedChildren = true;
#if QT_CONFIG(filesystemwatcher)
    d->fileInfoGatherer->list(filePath(parent));
#endif
}